

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_blurshader.cpp
# Opt level: O0

FString __thiscall
FBlurShader::FragmentShaderCode(FBlurShader *this,float blurAmount,int sampleCount,bool vertical)

{
  uint uVar1;
  FString fmt;
  uint *puVar2;
  float *pfVar3;
  char *pcVar4;
  byte in_CL;
  int sampleCount_00;
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  int local_6c;
  int i;
  FString loopCode;
  char *fragmentShader;
  undefined1 local_48 [8];
  TArray<int,_int> sampleOffsets;
  TArray<float,_float> sampleWeights;
  bool vertical_local;
  int sampleCount_local;
  float blurAmount_local;
  FBlurShader *this_local;
  FString *code;
  
  sampleCount_00 = (int)CONCAT71(in_register_00000011,vertical);
  TArray<float,_float>::TArray((TArray<float,_float> *)&sampleOffsets.Most);
  TArray<int,_int>::TArray((TArray<int,_int> *)local_48);
  ComputeBlurSamples((FBlurShader *)CONCAT44(in_register_00000034,sampleCount),sampleCount_00,
                     blurAmount,(TArray<float,_float> *)&sampleOffsets.Most,
                     (TArray<int,_int> *)local_48);
  loopCode.Chars =
       "\n\t\tin vec2 TexCoord;\n\t\tuniform sampler2D SourceTexture;\n\t\tout vec4 FragColor;\n\t\t#if __VERSION__ < 130\n\t\tuniform float ScaleX;\n\t\tuniform float ScaleY;\n\t\tvec4 textureOffset(sampler2D s, vec2 texCoord, ivec2 offset)\n\t\t{\n\t\t\treturn texture2D(s, texCoord + vec2(ScaleX * float(offset.x), ScaleY * float(offset.y)));\n\t\t}\n\t\t#endif\n\t\tvoid main()\n\t\t{\n\t\t\tFragColor = %s;\n\t\t}\n\t\t"
  ;
  FString::FString((FString *)&stack0xffffffffffffff98);
  for (local_6c = 0; local_6c < sampleCount_00; local_6c = local_6c + 1) {
    if (0 < local_6c) {
      FString::operator+=((FString *)&stack0xffffffffffffff98," + ");
    }
    if ((in_CL & 1) == 0) {
      puVar2 = (uint *)TArray<int,_int>::operator[]((TArray<int,_int> *)local_48,(long)local_6c);
      uVar1 = *puVar2;
      pfVar3 = TArray<float,_float>::operator[]
                         ((TArray<float,_float> *)&sampleOffsets.Most,(long)local_6c);
      FString::AppendFormat
                ((FString *)&stack0xffffffffffffff98,
                 "\r\n\t\t\ttextureOffset(SourceTexture, TexCoord, ivec2(%d, 0)) * %f",
                 (double)*pfVar3,(ulong)uVar1);
    }
    else {
      puVar2 = (uint *)TArray<int,_int>::operator[]((TArray<int,_int> *)local_48,(long)local_6c);
      uVar1 = *puVar2;
      pfVar3 = TArray<float,_float>::operator[]
                         ((TArray<float,_float> *)&sampleOffsets.Most,(long)local_6c);
      FString::AppendFormat
                ((FString *)&stack0xffffffffffffff98,
                 "\r\n\t\t\ttextureOffset(SourceTexture, TexCoord, ivec2(0, %d)) * %f",
                 (double)*pfVar3,(ulong)uVar1);
    }
  }
  FString::FString((FString *)this);
  fmt = loopCode;
  pcVar4 = FString::GetChars((FString *)&stack0xffffffffffffff98);
  FString::Format((FString *)this,fmt.Chars,pcVar4);
  FString::~FString((FString *)&stack0xffffffffffffff98);
  TArray<int,_int>::~TArray((TArray<int,_int> *)local_48);
  TArray<float,_float>::~TArray((TArray<float,_float> *)&sampleOffsets.Most);
  return (FString)(char *)this;
}

Assistant:

FString FBlurShader::FragmentShaderCode(float blurAmount, int sampleCount, bool vertical)
{
	TArray<float> sampleWeights;
	TArray<int> sampleOffsets;
	ComputeBlurSamples(sampleCount, blurAmount, sampleWeights, sampleOffsets);

	const char *fragmentShader =
		R"(
		in vec2 TexCoord;
		uniform sampler2D SourceTexture;
		out vec4 FragColor;
		#if __VERSION__ < 130
		uniform float ScaleX;
		uniform float ScaleY;
		vec4 textureOffset(sampler2D s, vec2 texCoord, ivec2 offset)
		{
			return texture2D(s, texCoord + vec2(ScaleX * float(offset.x), ScaleY * float(offset.y)));
		}
		#endif
		void main()
		{
			FragColor = %s;
		}
		)";

	FString loopCode;
	for (int i = 0; i < sampleCount; i++)
	{
		if (i > 0)
			loopCode += " + ";

		if (vertical)
			loopCode.AppendFormat("\r\n\t\t\ttextureOffset(SourceTexture, TexCoord, ivec2(0, %d)) * %f", sampleOffsets[i], (double)sampleWeights[i]);
		else
			loopCode.AppendFormat("\r\n\t\t\ttextureOffset(SourceTexture, TexCoord, ivec2(%d, 0)) * %f", sampleOffsets[i], (double)sampleWeights[i]);
	}

	FString code;
	code.Format(fragmentShader, loopCode.GetChars());
	return code;
}